

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::OneHotEncoder::ByteSizeLong(OneHotEncoder *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = (size_t)((uint)this->outputsparse_ * 2);
  uVar2 = this->handleunknown_;
  if (uVar2 != 0) {
    if ((int)uVar2 < 0) {
      uVar3 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar2 | 1) != 0) {
        for (; (uVar2 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar3 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar5 = sVar5 + uVar3;
  }
  if (this->_oneof_case_[0] == 2) {
    sVar4 = Int64Vector::ByteSizeLong((this->CategoryType_).int64categories_);
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_0026d7bd;
    sVar4 = StringVector::ByteSizeLong((this->CategoryType_).stringcategories_);
  }
  uVar2 = (uint)sVar4 | 1;
  iVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
LAB_0026d7bd:
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t OneHotEncoder::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.OneHotEncoder)
  size_t total_size = 0;

  // bool outputSparse = 10;
  if (this->outputsparse() != 0) {
    total_size += 1 + 1;
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->handleunknown() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->handleunknown());
  }

  switch (CategoryType_case()) {
    // .CoreML.Specification.StringVector stringCategories = 1;
    case kStringCategories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.stringcategories_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64Categories = 2;
    case kInt64Categories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.int64categories_);
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}